

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_data.hpp
# Opt level: O1

bool ex::readDataSet(string *dir_name,
                    vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                    *points,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *answers,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                    *distances)

{
  uint uVar1;
  pointer pcVar2;
  element_type *this;
  char cVar3;
  int iVar4;
  error_code *peVar5;
  ostream *poVar6;
  istream *piVar7;
  WeightVectorPhrase *__p;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_330;
  ifstream fi;
  dir_itr_imp local_320 [16];
  uint auStack_310 [122];
  size_type *local_128;
  path targetDir;
  undefined1 local_e8 [8];
  string line;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> arr;
  undefined1 local_a8 [8];
  shared_ptr<wv::WeightVectorPhrase> swv;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  concr_phrase;
  directory_iterator local_60;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_128 = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  targetDir.m_pathname.field_2._8_8_ = answers;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_60,(path *)&local_128,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_330 = local_60.m_imp.px;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  _fi = 0;
  eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_60;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  local_48.px = (dir_itr_imp *)0x0;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_330);
  local_330 = eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  local_38 = (directory_iterator)(directory_iterator)eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_330);
  local_330.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  local_40.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_330);
  do {
    if ((local_38.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) ||
       (((local_38.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) &&
        ((local_40.px == (dir_itr_imp *)0x0 || (*(long *)(local_40.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
      bVar8 = true;
LAB_00120527:
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_60.m_imp);
      if (local_128 != &targetDir.m_pathname._M_string_length) {
        operator_delete(local_128);
      }
      return bVar8;
    }
    peVar5 = (error_code *)boost::filesystem::directory_iterator::dereference(&local_38);
    boost::filesystem::detail::status((path *)&local_330,peVar5);
    if ((int)local_330.px == 2) {
      boost::filesystem::path::extension();
      iVar4 = boost::filesystem::path::compare((path *)&local_330,"swp");
      if (local_330.px != local_320) {
        operator_delete(local_330.px);
      }
      if (iVar4 != 0) {
        std::ifstream::ifstream((istream *)&local_330,(string *)peVar5,_S_in);
        uVar1 = *(uint *)((long)auStack_310 + *(long *)(local_330.px + -0x18));
        if ((uVar1 & 5) == 0) {
          local_e8 = (undefined1  [8])&line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          concr_phrase.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_88 = (undefined1  [8])0x0;
          concr_phrase.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          while( true ) {
            cVar3 = std::ios::widen((char)*(undefined8 *)(local_330.px + -0x18) +
                                    (char)(istream *)&local_330);
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&local_330,(string *)local_e8,cVar3);
            if ((((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) ||
               (line._M_dataplus._M_p == (pointer)0x0)) break;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_88,(value_type *)local_e8);
          }
          cont::
          StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((long)&line.field_2 + 8),
                        (uint32_t)
                        ((ulong)((long)concr_phrase.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88)
                        >> 5));
          if ((undefined1  [8])
              concr_phrase.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_88) {
            uVar9 = 1;
            uVar10 = 0;
            do {
              std::__cxx11::string::_M_assign((string *)(uVar10 * 0x20 + line.field_2._8_8_));
              uVar10 = (ulong)uVar9;
              uVar9 = uVar9 + 1;
            } while (uVar10 < (ulong)((long)concr_phrase.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                      (long)auStack_88 >> 5));
          }
          boost::filesystem::path::filename();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)targetDir.m_pathname.field_2._8_8_,(value_type *)local_a8);
          if (local_a8 !=
              (undefined1  [8])
              &swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount) {
            operator_delete((void *)local_a8);
          }
          __p = (WeightVectorPhrase *)operator_new(0x20);
          (__p->super_AbstractWeightVector)._vptr_AbstractWeightVector =
               (_func_int **)&PTR_calcDistance_00148c68;
          cont::
          StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::StaticArray(&__p->m_Coords,
                        (StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((long)&line.field_2 + 8));
          __p->m_Distances = distances;
          local_a8 = (undefined1  [8])__p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wv::WeightVectorPhrase*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&swv,__p);
          this = swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          arr._8_8_ = local_a8;
          if (swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_Coords).m_MasPoint =
                   *(int *)&((swv.
                              super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_Coords).m_MasPoint + 1;
              UNLOCK();
            }
            else {
              *(int *)&((swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_Coords).m_MasPoint =
                   *(int *)&((swv.
                              super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_Coords).m_MasPoint + 1;
            }
          }
          std::
          vector<std::shared_ptr<wv::AbstractWeightVector>,std::allocator<std::shared_ptr<wv::AbstractWeightVector>>>
          ::emplace_back<std::shared_ptr<wv::AbstractWeightVector>>
                    ((vector<std::shared_ptr<wv::AbstractWeightVector>,std::allocator<std::shared_ptr<wv::AbstractWeightVector>>>
                      *)points,(shared_ptr<wv::AbstractWeightVector> *)&arr.m_Size);
          if (this != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          }
          if (swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       swv.super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
          cont::
          StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&line.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_88);
          if (local_e8 != (undefined1  [8])&line._M_string_length) {
            operator_delete((void *)local_e8);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)peVar5,(long)peVar5->cat_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"doesn\'t exist",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        std::ifstream::~ifstream((istream *)&local_330);
        if ((uVar1 & 5) != 0) {
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                    (&local_38.m_imp);
          bVar8 = false;
          goto LAB_00120527;
        }
      }
    }
    boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
  } while( true );
}

Assistant:

bool readDataSet(const std::string& dir_name, std::vector<std::shared_ptr<wv::Point>>& points, std::vector<std::string>& answers, const std::unordered_map<std::string, std::unordered_map<std::string, double>>& distances)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<std::string> concr_phrase;
                while (std::getline(fi, line) and !line.empty())
                {
                    concr_phrase.push_back(line);
                }
                
                cont::StaticArray<std::string> arr(concr_phrase.size());
                for (uint32_t i = 0; i < concr_phrase.size(); i++)
                    arr[i] = concr_phrase[i];
                    
                answers.push_back(p.filename().string());
                std::shared_ptr<wv::WeightVectorPhrase> swv(new wv::WeightVectorPhrase(arr, distances));
                points.push_back(swv);
            } 
        }
        return true;
    }